

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollArea::setScrolledAreaSize(AbstractScrollArea *this,QSize *s)

{
  ((this->d).d)->scrolledAreaSize = *s;
  AbstractScrollAreaPrivate::normalizePosition((this->d).d);
  AbstractScrollAreaPrivate::calcIndicators((this->d).d);
  QWidget::update();
  QWidget::update();
  QWidget::update();
  return;
}

Assistant:

void
AbstractScrollArea::setScrolledAreaSize( const QSize & s )
{
	d->scrolledAreaSize = s;

	d->normalizePosition();

	d->calcIndicators();

	update();
	d->horIndicator->update();
	d->vertIndicator->update();
}